

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_36::WebSocketPipeImpl::BlockedPumpFrom::abort(BlockedPumpFrom *this)

{
  PromiseFulfiller<void> *pPVar1;
  char (*in_RCX) [41];
  String local_1c8;
  Exception local_1b0;
  ArrayPtr<const_char> local_20;
  BlockedPumpFrom *local_10;
  BlockedPumpFrom *this_local;
  
  local_10 = this;
  StringPtr::StringPtr((StringPtr *)&local_20,"other end of WebSocketPipe was destroyed");
  Canceler::cancel(&this->canceler,(StringPtr)local_20);
  pPVar1 = this->fulfiller;
  kj::_::Debug::makeDescription<char_const(&)[41]>
            (&local_1c8,(Debug *)"\"other end of WebSocketPipe was destroyed\"",
             "other end of WebSocketPipe was destroyed",in_RCX);
  Exception::Exception
            (&local_1b0,DISCONNECTED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x1002,&local_1c8);
  (**(pPVar1->super_PromiseRejector)._vptr_PromiseRejector)(pPVar1,&local_1b0);
  Exception::~Exception(&local_1b0);
  String::~String(&local_1c8);
  endState(this->pipe,&this->super_WebSocket);
  WebSocketPipeImpl::abort(this->pipe);
  return;
}

Assistant:

void abort() override {
      canceler.cancel("other end of WebSocketPipe was destroyed");
      fulfiller.reject(KJ_EXCEPTION(DISCONNECTED, "other end of WebSocketPipe was destroyed"));
      pipe.endState(*this);
      pipe.abort();
    }